

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_script.cpp
# Opt level: O2

RPCHelpMan * deriveaddresses(void)

{
  long lVar1;
  string name;
  string name_00;
  string m_key_name;
  string cond;
  string m_key_name_00;
  string m_key_name_01;
  string cond_00;
  string description;
  string m_key_name_02;
  string description_00;
  string description_01;
  string m_key_name_03;
  string description_02;
  Fallback fallback;
  Fallback fallback_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  string description_03;
  string description_04;
  RPCResults results;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  RPCExamples examples;
  string description_05;
  string description_06;
  RPCMethodImpl fun;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  long lVar2;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> results_00;
  undefined8 in_stack_fffffffffffff4d8;
  undefined8 in_stack_fffffffffffff4e0;
  undefined8 in_stack_fffffffffffff4e8;
  undefined8 in_stack_fffffffffffff4f0;
  _Manager_type in_stack_fffffffffffff4f8;
  undefined8 in_stack_fffffffffffff500;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff508;
  pointer in_stack_fffffffffffff518;
  pointer pRVar3;
  pointer in_stack_fffffffffffff520;
  pointer pRVar4;
  pointer in_stack_fffffffffffff528;
  pointer pRVar5;
  pointer in_stack_fffffffffffff530;
  undefined1 in_stack_fffffffffffff538 [16];
  pointer in_stack_fffffffffffff548;
  undefined8 in_stack_fffffffffffff550;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff558;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff568;
  pointer in_stack_fffffffffffff578;
  pointer pRVar6;
  pointer in_stack_fffffffffffff580;
  pointer pRVar7;
  pointer in_stack_fffffffffffff588;
  undefined1 in_stack_fffffffffffff590 [48];
  RPCResults local_a40;
  allocator_type local_a25;
  allocator<char> local_a24;
  allocator<char> local_a23;
  allocator<char> local_a22;
  allocator<char> local_a21;
  vector<RPCArg,_std::allocator<RPCArg>_> local_a20;
  allocator<char> local_a02;
  allocator<char> local_a01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9e0;
  string local_9c0;
  string local_9a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_980;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_960;
  string local_940;
  string local_920;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_900;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e0;
  char *local_8c0;
  size_type local_8b8;
  char local_8b0 [8];
  undefined8 uStack_8a8;
  string local_8a0 [32];
  string local_880 [32];
  RPCResult local_860;
  string local_7d8 [32];
  string local_7b8 [32];
  RPCResult local_798;
  string local_710 [32];
  string local_6f0 [32];
  string local_6d0 [32];
  string local_6b0 [32];
  string local_690 [32];
  RPCResult local_670;
  string local_5e8 [32];
  string local_5c8 [32];
  string local_5a8 [32];
  RPCResult local_588 [2];
  RPCArgOptions local_478;
  string local_430 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_410;
  undefined1 local_3b8;
  string local_3b0 [32];
  RPCArgOptions local_390;
  string local_348 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_328;
  undefined1 local_2d0;
  string local_2c8 [32];
  RPCArg local_2a8 [2];
  string local_98 [32];
  string local_78 [32];
  string EXAMPLE_DESCRIPTOR;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&EXAMPLE_DESCRIPTOR,
             "wpkh([d34db33f/84h/0h/0h]xpub6DJ2dNUysrn5Vt36jH2KLBT2i1auw1tTSSomg8PhqNiUtx8QX2SvC9nrHu81fT41fvDUnhMjEzQgXnQjKEu3oaqMSzhSrHMxyyoEAmUHQbY/0/*)#cjjspncu"
             ,(allocator<char> *)local_2a8);
  std::__cxx11::string::string<std::allocator<char>>(local_78,"deriveaddresses",&local_a01);
  std::__cxx11::string::string<std::allocator<char>>
            (local_98,
             "\nDerives one or more addresses corresponding to an output descriptor.\nExamples of output descriptors are:\n    pkh(<pubkey>)                                     P2PKH outputs for the given pubkey\n    wpkh(<pubkey>)                                    Native segwit P2PKH outputs for the given pubkey\n    sh(multi(<n>,<pubkey>,<pubkey>,...))              P2SH-multisig outputs for the given threshold and pubkeys\n    raw(<hex script>)                                 Outputs whose output script equals the specified hex-encoded bytes\n    tr(<pubkey>,multi_a(<n>,<pubkey>,<pubkey>,...))   P2TR-multisig outputs for the given threshold and pubkeys\n\nIn the above, <pubkey> either refers to a fixed public key in hexadecimal notation, or to an xpub/xprv optionally followed by one\nor more path elements separated by \"/\", where \"h\" represents a hardened child key.\nFor more information on output descriptors, see the documentation in the doc/descriptors.md file.\n"
             ,&local_a02);
  std::__cxx11::string::string<std::allocator<char>>(local_2c8,"descriptor",&local_a21);
  local_328._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_2d0 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_348,"The descriptor.",&local_a22);
  local_390.oneline_description._M_dataplus._M_p = (pointer)&local_390.oneline_description.field_2;
  local_390.skip_type_check = false;
  local_390.oneline_description._M_string_length = 0;
  local_390.oneline_description.field_2._M_local_buf[0] = '\0';
  local_390.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_390.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_390.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_390.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_390._58_8_ = 0;
  name._M_string_length = in_stack_fffffffffffff4e0;
  name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4d8;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffff4e8;
  name.field_2._8_8_ = in_stack_fffffffffffff4f0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff500;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff4f8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff508;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff518;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff520;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff528;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff530;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_16_ = in_stack_fffffffffffff538;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_fffffffffffff548;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_fffffffffffff550;
  description_05.field_2 = in_stack_fffffffffffff568;
  description_05._0_16_ = in_stack_fffffffffffff558;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff580;
  opts._0_8_ = in_stack_fffffffffffff578;
  opts.oneline_description._M_string_length = (size_type)in_stack_fffffffffffff588;
  opts.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffff590._0_16_;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffff590._16_24_;
  opts.hidden = (bool)in_stack_fffffffffffff590[0x28];
  opts.also_positional = (bool)in_stack_fffffffffffff590[0x29];
  opts._66_6_ = in_stack_fffffffffffff590._42_6_;
  RPCArg::RPCArg(local_2a8,name,(Type)local_2c8,fallback,description_05,opts);
  std::__cxx11::string::string<std::allocator<char>>(local_3b0,"range",&local_a23);
  local_410._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_3b8 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_430,
             "If a ranged descriptor is used, this specifies the end or the range (in [begin,end] notation) to derive."
             ,&local_a24);
  local_478.oneline_description._M_dataplus._M_p = (pointer)&local_478.oneline_description.field_2;
  local_478.skip_type_check = false;
  local_478.oneline_description._M_string_length = 0;
  local_478.oneline_description.field_2._M_local_buf[0] = '\0';
  local_478.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_478.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_478.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_478.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_478._58_8_ = 0;
  name_00._M_string_length = in_stack_fffffffffffff4e0;
  name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4d8;
  name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff4e8;
  name_00.field_2._8_8_ = in_stack_fffffffffffff4f0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff500;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff4f8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff508;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff518;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff520;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff528;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff530;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_16_ = in_stack_fffffffffffff538;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_fffffffffffff548;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_fffffffffffff550;
  description_06.field_2 = in_stack_fffffffffffff568;
  description_06._0_16_ = in_stack_fffffffffffff558;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff580;
  opts_00._0_8_ = in_stack_fffffffffffff578;
  opts_00.oneline_description._M_string_length = (size_type)in_stack_fffffffffffff588;
  opts_00.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffff590._0_16_;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffff590._16_24_;
  opts_00.hidden = (bool)in_stack_fffffffffffff590[0x28];
  opts_00.also_positional = (bool)in_stack_fffffffffffff590[0x29];
  opts_00._66_6_ = in_stack_fffffffffffff590._42_6_;
  RPCArg::RPCArg(local_2a8 + 1,name_00,(Type)local_3b0,fallback_00,description_06,opts_00);
  __l._M_len = 2;
  __l._M_array = local_2a8;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_a20,__l,&local_a25);
  std::__cxx11::string::string<std::allocator<char>>
            (local_5a8,"for single derivation descriptors",
             (allocator<char> *)&stack0xfffffffffffff5bf);
  std::__cxx11::string::string<std::allocator<char>>
            (local_5c8,"",(allocator<char> *)&stack0xfffffffffffff5be);
  std::__cxx11::string::string<std::allocator<char>>
            (local_5e8,"",(allocator<char> *)&stack0xfffffffffffff5bd);
  std::__cxx11::string::string<std::allocator<char>>
            (local_690,"address",(allocator<char> *)&stack0xfffffffffffff59f);
  std::__cxx11::string::string<std::allocator<char>>
            (local_6b0,"the derived addresses",(allocator<char> *)&stack0xfffffffffffff59e);
  pRVar6 = (pointer)0x0;
  pRVar7 = (pointer)0x0;
  m_key_name._M_string_length = in_stack_fffffffffffff4e0;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4d8;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff4e8;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff4f0;
  description._M_string_length = in_stack_fffffffffffff500;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4f8;
  description.field_2 = in_stack_fffffffffffff508;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffff520;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffff518;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff528;
  RPCResult::RPCResult(&local_670,STR,m_key_name,description,inner,SUB81(local_690,0));
  __l_00._M_len = 1;
  __l_00._M_array = &local_670;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff5a0,__l_00,
             (allocator_type *)&stack0xfffffffffffff577);
  cond._M_string_length = in_stack_fffffffffffff4e0;
  cond._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4d8;
  cond.field_2._M_allocated_capacity = in_stack_fffffffffffff4e8;
  cond.field_2._8_8_ = in_stack_fffffffffffff4f0;
  m_key_name_02._M_string_length = in_stack_fffffffffffff500;
  m_key_name_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4f8;
  m_key_name_02.field_2 = in_stack_fffffffffffff508;
  description_03._M_string_length = (size_type)in_stack_fffffffffffff520;
  description_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff518;
  description_03.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff528;
  description_03.field_2._8_8_ = in_stack_fffffffffffff530;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff548;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_fffffffffffff538._0_8_;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_fffffffffffff538._8_8_;
  RPCResult::RPCResult(local_588,cond,(Type)local_5a8,m_key_name_02,description_03,inner_02);
  std::__cxx11::string::string<std::allocator<char>>
            (local_6d0,"for multipath descriptors",(allocator<char> *)&stack0xfffffffffffff576);
  std::__cxx11::string::string<std::allocator<char>>
            (local_6f0,"",(allocator<char> *)&stack0xfffffffffffff575);
  std::__cxx11::string::string<std::allocator<char>>
            (local_710,
             "The derived addresses for each of the multipath expansions of the descriptor, in multipath specifier order"
             ,(allocator<char> *)&stack0xfffffffffffff574);
  std::__cxx11::string::string<std::allocator<char>>
            (local_7b8,"",(allocator<char> *)&stack0xfffffffffffff557);
  std::__cxx11::string::string<std::allocator<char>>
            (local_7d8,"The derived addresses for a multipath descriptor expansion",
             (allocator<char> *)&stack0xfffffffffffff556);
  std::__cxx11::string::string<std::allocator<char>>
            (local_880,"address",(allocator<char> *)&stack0xfffffffffffff537);
  std::__cxx11::string::string<std::allocator<char>>
            (local_8a0,"the derived address",(allocator<char> *)&stack0xfffffffffffff536);
  pRVar3 = (pointer)0x0;
  pRVar4 = (pointer)0x0;
  pRVar5 = (pointer)0x0;
  m_key_name_00._M_string_length = in_stack_fffffffffffff4e0;
  m_key_name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4d8;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff4e8;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff4f0;
  description_00._M_string_length = in_stack_fffffffffffff500;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4f8;
  description_00.field_2 = in_stack_fffffffffffff508;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult(&local_860,STR,m_key_name_00,description_00,inner_00,SUB81(local_880,0));
  __l_01._M_len = 1;
  __l_01._M_array = &local_860;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff538,__l_01,
             (allocator_type *)&stack0xfffffffffffff517);
  m_key_name_01._M_string_length = in_stack_fffffffffffff4e0;
  m_key_name_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4d8;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff4e8;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff4f0;
  description_01._M_string_length = in_stack_fffffffffffff500;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4f8;
  description_01.field_2 = in_stack_fffffffffffff508;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar4;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar3;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar5;
  RPCResult::RPCResult(&local_798,ARR,m_key_name_01,description_01,inner_01,SUB81(local_7b8,0));
  __l_02._M_len = 1;
  __l_02._M_array = &local_798;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff558,__l_02,
             (allocator_type *)&stack0xfffffffffffff516);
  cond_00._M_string_length = in_stack_fffffffffffff4e0;
  cond_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4d8;
  cond_00.field_2._M_allocated_capacity = in_stack_fffffffffffff4e8;
  cond_00.field_2._8_8_ = in_stack_fffffffffffff4f0;
  m_key_name_03._M_string_length = in_stack_fffffffffffff500;
  m_key_name_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4f8;
  m_key_name_03.field_2 = in_stack_fffffffffffff508;
  description_04._M_string_length = (size_type)pRVar4;
  description_04._M_dataplus._M_p = (pointer)pRVar3;
  description_04.field_2._M_allocated_capacity = (size_type)pRVar5;
  description_04.field_2._8_8_ = in_stack_fffffffffffff530;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff548;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_fffffffffffff538._0_8_;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_fffffffffffff538._8_8_;
  RPCResult::RPCResult(local_588 + 1,cond_00,(Type)local_6d0,m_key_name_03,description_04,inner_03);
  results_00._M_len = 2;
  results_00._M_array = local_588;
  RPCResults::RPCResults(&local_a40,results_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_940,"deriveaddresses",(allocator<char> *)&stack0xfffffffffffff515);
  std::operator+(&local_980,"\"",&EXAMPLE_DESCRIPTOR);
  std::operator+(&local_960,&local_980,"\" \"[0,2]\"");
  HelpExampleCli(&local_920,&local_940,&local_960);
  std::operator+(&local_900,"First three native segwit receive addresses\n",&local_920);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9c0,"deriveaddresses",(allocator<char> *)&stack0xfffffffffffff514);
  std::operator+(&local_a00,"\"",&EXAMPLE_DESCRIPTOR);
  std::operator+(&local_9e0,&local_a00,"\", \"[0,2]\"");
  HelpExampleRpc(&local_9a0,&local_9c0,&local_9e0);
  std::operator+(&local_8e0,&local_900,&local_9a0);
  local_8c0 = local_8b0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e0._M_dataplus._M_p == &local_8e0.field_2) {
    uStack_8a8 = local_8e0.field_2._8_8_;
  }
  else {
    local_8c0 = local_8e0._M_dataplus._M_p;
  }
  local_8b8 = local_8e0._M_string_length;
  local_8e0._M_string_length = 0;
  local_8e0.field_2._M_local_buf[0] = '\0';
  description_02._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/output_script.cpp:300:9)>
       ::_M_invoke;
  description_02._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/output_script.cpp:300:9)>
                ::_M_manager;
  description_02.field_2 = in_stack_fffffffffffff508;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar4;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar3;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar5;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff538._0_8_;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff538._8_8_;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = in_stack_fffffffffffff530;
  examples.m_examples._M_string_length = in_stack_fffffffffffff550;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_fffffffffffff548;
  examples.m_examples.field_2 = in_stack_fffffffffffff558;
  fun.super__Function_base._M_manager = (_Manager_type)pRVar6;
  fun.super__Function_base._M_functor._M_pod_data = in_stack_fffffffffffff568._M_local_buf;
  fun._M_invoker = (_Invoker_type)pRVar7;
  local_8e0._M_dataplus._M_p = (pointer)&local_8e0.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffff4e0,&stack0xfffffffffffff4e8)),
             description_02,args,results,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffff4e8);
  std::__cxx11::string::~string((string *)&local_8c0);
  std::__cxx11::string::~string((string *)&local_8e0);
  std::__cxx11::string::~string((string *)&local_9a0);
  std::__cxx11::string::~string((string *)&local_9e0);
  std::__cxx11::string::~string((string *)&local_a00);
  std::__cxx11::string::~string((string *)&local_9c0);
  std::__cxx11::string::~string((string *)&local_900);
  std::__cxx11::string::~string((string *)&local_920);
  std::__cxx11::string::~string((string *)&local_960);
  std::__cxx11::string::~string((string *)&local_980);
  std::__cxx11::string::~string((string *)&local_940);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_a40.m_results);
  lVar2 = 0x88;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_588[0].m_type + lVar2));
    lVar2 = lVar2 + -0x88;
  } while (lVar2 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff558);
  RPCResult::~RPCResult(&local_798);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff538);
  RPCResult::~RPCResult(&local_860);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff518);
  std::__cxx11::string::~string(local_8a0);
  std::__cxx11::string::~string(local_880);
  std::__cxx11::string::~string(local_7d8);
  std::__cxx11::string::~string(local_7b8);
  std::__cxx11::string::~string(local_710);
  std::__cxx11::string::~string(local_6f0);
  std::__cxx11::string::~string(local_6d0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff5a0);
  RPCResult::~RPCResult(&local_670);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff578);
  std::__cxx11::string::~string(local_6b0);
  std::__cxx11::string::~string(local_690);
  std::__cxx11::string::~string(local_5e8);
  std::__cxx11::string::~string(local_5c8);
  std::__cxx11::string::~string(local_5a8);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_a20);
  lVar2 = 0x108;
  do {
    RPCArg::~RPCArg((RPCArg *)((long)&local_2a8[0].m_names._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x108;
  } while (lVar2 != -0x108);
  RPCArgOptions::~RPCArgOptions(&local_478);
  std::__cxx11::string::~string(local_430);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_410._M_first);
  std::__cxx11::string::~string(local_3b0);
  RPCArgOptions::~RPCArgOptions(&local_390);
  std::__cxx11::string::~string(local_348);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_328._M_first);
  std::__cxx11::string::~string(local_2c8);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string((string *)&EXAMPLE_DESCRIPTOR);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan deriveaddresses()
{
    const std::string EXAMPLE_DESCRIPTOR = "wpkh([d34db33f/84h/0h/0h]xpub6DJ2dNUysrn5Vt36jH2KLBT2i1auw1tTSSomg8PhqNiUtx8QX2SvC9nrHu81fT41fvDUnhMjEzQgXnQjKEu3oaqMSzhSrHMxyyoEAmUHQbY/0/*)#cjjspncu";

    return RPCHelpMan{"deriveaddresses",
        {"\nDerives one or more addresses corresponding to an output descriptor.\n"
         "Examples of output descriptors are:\n"
         "    pkh(<pubkey>)                                     P2PKH outputs for the given pubkey\n"
         "    wpkh(<pubkey>)                                    Native segwit P2PKH outputs for the given pubkey\n"
         "    sh(multi(<n>,<pubkey>,<pubkey>,...))              P2SH-multisig outputs for the given threshold and pubkeys\n"
         "    raw(<hex script>)                                 Outputs whose output script equals the specified hex-encoded bytes\n"
         "    tr(<pubkey>,multi_a(<n>,<pubkey>,<pubkey>,...))   P2TR-multisig outputs for the given threshold and pubkeys\n"
         "\nIn the above, <pubkey> either refers to a fixed public key in hexadecimal notation, or to an xpub/xprv optionally followed by one\n"
         "or more path elements separated by \"/\", where \"h\" represents a hardened child key.\n"
         "For more information on output descriptors, see the documentation in the doc/descriptors.md file.\n"},
        {
            {"descriptor", RPCArg::Type::STR, RPCArg::Optional::NO, "The descriptor."},
            {"range", RPCArg::Type::RANGE, RPCArg::Optional::OMITTED, "If a ranged descriptor is used, this specifies the end or the range (in [begin,end] notation) to derive."},
        },
        {
            RPCResult{"for single derivation descriptors",
                RPCResult::Type::ARR, "", "",
                {
                    {RPCResult::Type::STR, "address", "the derived addresses"},
                }
            },
            RPCResult{"for multipath descriptors",
                RPCResult::Type::ARR, "", "The derived addresses for each of the multipath expansions of the descriptor, in multipath specifier order",
                {
                    {
                        RPCResult::Type::ARR, "", "The derived addresses for a multipath descriptor expansion",
                        {
                            {RPCResult::Type::STR, "address", "the derived address"},
                        },
                    },
                },
            },
        },
        RPCExamples{
            "First three native segwit receive addresses\n" +
            HelpExampleCli("deriveaddresses", "\"" + EXAMPLE_DESCRIPTOR + "\" \"[0,2]\"") +
            HelpExampleRpc("deriveaddresses", "\"" + EXAMPLE_DESCRIPTOR + "\", \"[0,2]\"")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
        {
            const std::string desc_str = request.params[0].get_str();

            int64_t range_begin = 0;
            int64_t range_end = 0;

            if (request.params.size() >= 2 && !request.params[1].isNull()) {
                std::tie(range_begin, range_end) = ParseDescriptorRange(request.params[1]);
            }

            FlatSigningProvider key_provider;
            std::string error;
            auto descs = Parse(desc_str, key_provider, error, /* require_checksum = */ true);
            if (descs.empty()) {
                throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, error);
            }
            auto& desc = descs.at(0);
            if (!desc->IsRange() && request.params.size() > 1) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Range should not be specified for an un-ranged descriptor");
            }

            if (desc->IsRange() && request.params.size() == 1) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Range must be specified for a ranged descriptor");
            }

            UniValue addresses = DeriveAddresses(desc.get(), range_begin, range_end, key_provider);

            if (descs.size() == 1) {
                return addresses;
            }

            UniValue ret(UniValue::VARR);
            ret.push_back(addresses);
            for (size_t i = 1; i < descs.size(); ++i) {
                ret.push_back(DeriveAddresses(descs.at(i).get(), range_begin, range_end, key_provider));
            }
            return ret;
        },
    };
}